

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

bool __thiscall
testing::internal::
TypedExpectation<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
::Matches(TypedExpectation<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
          *this,ArgumentTuple *args)

{
  bool bVar1;
  undefined1 uVar2;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>,testing::Matcher<std::chrono::duration<long,std::ratio<1l,1000l>>>>,std::tuple<std::vector<unsigned_char,std::allocator<unsigned_char>>const&,std::chrono::duration<long,std::ratio<1l,1000l>>>>
                    ((tuple<testing::Matcher<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                      *)(this + 0xf0),args);
  if (bVar1) {
    uVar2 = (**(code **)(**(long **)(this + 0x128) + 0x20))(*(long **)(this + 0x128),args);
  }
  else {
    uVar2 = 0;
  }
  return (bool)uVar2;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }